

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O1

char * cmSHA256_End(SHA_CTX *context,char *buffer)

{
  byte bVar1;
  int j;
  long lVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  sha_byte digest [32];
  uint local_38 [8];
  
  if (context != (SHA_CTX *)0x0) {
    if (buffer == (char *)0x0) {
      pcVar4 = (char *)0x0;
      memset(context,0,0xd0);
    }
    else {
      cmSHA256_Internal_Last(context);
      lVar2 = 0;
      do {
        uVar3 = *(uint *)((long)context + lVar2 * 4);
        uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
        *(uint *)((long)context + lVar2 * 4) = uVar3;
        local_38[lVar2] = uVar3;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 8);
      lVar5 = 0;
      memset(context,0,0xd0);
      lVar2 = 0;
      do {
        bVar1 = *(byte *)((long)local_38 + lVar2);
        buffer[lVar2 * 2] = "0123456789abcdef"[bVar1 >> 4];
        buffer[lVar2 * 2 + 1] = "0123456789abcdef"[bVar1 & 0xf];
        lVar2 = lVar2 + 1;
        lVar5 = lVar5 + -2;
      } while (lVar2 != 0x20);
      buffer[0x40] = '\0';
      pcVar4 = buffer + -lVar5;
    }
    return pcVar4;
  }
  __assert_fail("context != (SHA_CTX*)0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cm_sha2.c"
                ,0x454,"char *cmSHA256_End(SHA_CTX *, char *)");
}

Assistant:

char *SHA256_End(SHA_CTX* context, char buffer[]) {
	sha_byte	digest[SHA256_DIGEST_LENGTH], *d = digest;
	int		i;

	/* Sanity check: */
	assert(context != (SHA_CTX*)0);

	if (buffer != (char*)0) {
		SHA256_Final(digest, context);

		for (i = 0; i < SHA256_DIGEST_LENGTH; i++) {
			*buffer++ = sha_hex_digits[(*d & 0xf0) >> 4];
			*buffer++ = sha_hex_digits[*d & 0x0f];
			d++;
		}
		*buffer = (char)0;
	} else {
		MEMSET_BZERO(context, sizeof(*context));
	}
	MEMSET_BZERO(digest, SHA256_DIGEST_LENGTH);
	return buffer;
}